

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O2

list<PassDetails,_std::allocator<PassDetails>_> *
GeneratePassList_abi_cxx11_
          (list<PassDetails,_std::allocator<PassDetails>_> *__return_storage_ptr__,
          CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *start_time,DateTime *end_time,int time_step)

{
  bool bVar1;
  DateTime DVar2;
  long lVar3;
  DateTime current_time;
  DateTime previous_time;
  DateTime aos_time;
  DateTime los_time;
  PassDetails pd;
  Eci eci;
  CoordTopocentric topo;
  Observer obs;
  
  (__return_storage_ptr__->super__List_base<PassDetails,_std::allocator<PassDetails>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<PassDetails,_std::allocator<PassDetails>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<PassDetails,_std::allocator<PassDetails>_>)._M_impl.
  _M_node._M_size = 0;
  libsgp4::Observer::Observer(&obs,user_geo);
  libsgp4::DateTime::DateTime(&aos_time);
  libsgp4::DateTime::DateTime(&los_time);
  previous_time = (DateTime)start_time->m_encoded;
  lVar3 = end_time->m_encoded;
  bVar1 = false;
  current_time.m_encoded = previous_time.m_encoded;
  do {
    if (lVar3 <= current_time.m_encoded) {
      if (bVar1) {
        PassDetails::PassDetails((PassDetails *)&eci);
        eci.m_dt = aos_time;
        eci.m_position.x = (double)end_time->m_encoded;
        eci.m_position.y = FindMaxElevation(user_geo,sgp4,&aos_time,end_time);
        std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::push_back
                  (__return_storage_ptr__,(value_type *)&eci);
      }
      return __return_storage_ptr__;
    }
    libsgp4::SGP4::FindPosition(&eci,sgp4,&current_time);
    libsgp4::Observer::GetLookAngle(&topo,&obs,&eci);
    if ((bVar1) || (topo.elevation <= 0.0)) {
      if ((!bVar1) || (0.0 <= topo.elevation)) goto LAB_00102a76;
      los_time = FindCrossingPoint(user_geo,sgp4,&previous_time,&current_time,false);
      PassDetails::PassDetails(&pd);
      pd.aos = aos_time;
      pd.los = los_time;
      pd.max_elevation = FindMaxElevation(user_geo,sgp4,&aos_time,&los_time);
      std::__cxx11::list<PassDetails,_std::allocator<PassDetails>_>::push_back
                (__return_storage_ptr__,&pd);
      previous_time = current_time;
      current_time.m_encoded = current_time.m_encoded + 1800000000;
      bVar1 = false;
    }
    else {
      DVar2 = (DateTime)start_time->m_encoded;
      if (DVar2.m_encoded != current_time.m_encoded) {
        DVar2 = FindCrossingPoint(user_geo,sgp4,&previous_time,&current_time,true);
      }
      bVar1 = true;
      aos_time.m_encoded = DVar2.m_encoded;
LAB_00102a76:
      previous_time = current_time;
      current_time.m_encoded = current_time.m_encoded + (long)time_step * 1000000;
    }
    lVar3 = end_time->m_encoded;
    if (lVar3 <= current_time.m_encoded) {
      current_time.m_encoded = lVar3;
    }
  } while( true );
}

Assistant:

std::list<struct PassDetails> GeneratePassList(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& start_time,
        const libsgp4::DateTime& end_time,
        const int time_step)
{
    std::list<struct PassDetails> pass_list;

    libsgp4::Observer obs(user_geo);

    libsgp4::DateTime aos_time;
    libsgp4::DateTime los_time;

    bool found_aos = false;

    libsgp4::DateTime previous_time(start_time);
    libsgp4::DateTime current_time(start_time);

    while (current_time < end_time)
    {
        bool end_of_pass = false;

        /*
         * calculate satellite position
         */
        libsgp4::Eci eci = sgp4.FindPosition(current_time);
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

        if (!found_aos && topo.elevation > 0.0)
        {
            /*
             * aos hasnt occured yet, but the satellite is now above horizon
             * this must have occured within the last time_step
             */
            if (start_time == current_time)
            {
                /*
                 * satellite was already above the horizon at the start,
                 * so use the start time
                 */
                aos_time = start_time;
            }
            else
            {
                /*
                 * find the point at which the satellite crossed the horizon
                 */
                aos_time = FindCrossingPoint(
                        user_geo,
                        sgp4,
                        previous_time,
                        current_time,
                        true);
            }
            found_aos = true;
        }
        else if (found_aos && topo.elevation < 0.0)
        {
            found_aos = false;
            /*
             * end of pass, so move along more than time_step
             */
            end_of_pass = true;
            /*
             * already have the aos, but now the satellite is below the horizon,
             * so find the los
             */
            los_time = FindCrossingPoint(
                    user_geo,
                    sgp4,
                    previous_time,
                    current_time,
                    false);

            struct PassDetails pd;
            pd.aos = aos_time;
            pd.los = los_time;
            pd.max_elevation = FindMaxElevation(
                    user_geo,
                    sgp4,
                    aos_time,
                    los_time);

            pass_list.push_back(pd);
        }

        /*
         * save current time
         */
        previous_time = current_time;

        if (end_of_pass)
        {
            /*
             * at the end of the pass move the time along by 30mins
             */
            current_time = current_time + libsgp4::TimeSpan(0, 30, 0);
        }
        else
        {
            /*
             * move the time along by the time step value
             */
            current_time = current_time + libsgp4::TimeSpan(0, 0, time_step);
        }

        if (current_time > end_time)
        {
            /*
             * dont go past end time
             */
            current_time = end_time;
        }
    };

    if (found_aos)
    {
        /*
         * satellite still above horizon at end of search period, so use end
         * time as los
         */
        struct PassDetails pd;
        pd.aos = aos_time;
        pd.los = end_time;
        pd.max_elevation = FindMaxElevation(user_geo, sgp4, aos_time, end_time);
        pass_list.push_back(pd);
    }

    return pass_list;
}